

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O0

void __thiscall Args::Command::checkCorrectnessAfterParsing(Command *this)

{
  ulong uVar1;
  char *__rhs;
  BaseException *in_RDI;
  GroupIface *in_stack_00000010;
  allocator *__lhs;
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  allocator local_69;
  string local_68 [104];
  
  uVar1 = (**(code **)(*(long *)in_RDI + 0x30))();
  if ((uVar1 & 1) != 0) {
    GroupIface::checkCorrectnessAfterParsing(in_stack_00000010);
  }
  uVar1 = (**(code **)(*(long *)in_RDI + 0x30))();
  if ((((uVar1 & 1) != 0) && ((in_RDI[3].field_0x21 & 1) != 0)) &&
     (*(long *)&in_RDI[4].field_0x28 == 0)) {
    __rhs = (char *)__cxa_allocate_exception(0x30);
    __lhs = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,"Wasn\'t defined required sub-command of command \"",__lhs);
    (**(code **)(*(long *)in_RDI + 0x18))(local_a0);
    std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs)
    ;
    BaseException::BaseException(in_RDI,(String *)__lhs);
    __cxa_throw(__rhs,&BaseException::typeinfo,BaseException::~BaseException);
  }
  return;
}

Assistant:

void checkCorrectnessAfterParsing() const override
	{
		if( isDefined() )
			GroupIface::checkCorrectnessAfterParsing();

		if( isDefined() && m_isSubCommandRequired && !m_subCommand )
			throw BaseException( String( SL( "Wasn't defined required sub-command of command \"" ) ) +
				name() + SL( "\"." ) );
	}